

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSupp.c
# Opt level: O0

Vec_Ptr_t * Sim_ComputeStrSupp(Abc_Ntk_t *pNtk)

{
  void *pvVar1;
  void *pvVar2;
  void **ppvVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pAVar9;
  int local_44;
  int local_40;
  int k;
  int i;
  int nSuppWords;
  uint *pSimmNode2;
  uint *pSimmNode1;
  uint *pSimmNode;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vSuppStr;
  Abc_Ntk_t *pNtk_local;
  
  iVar5 = Abc_NtkCiNum(pNtk);
  uVar6 = Abc_NtkCiNum(pNtk);
  iVar5 = (iVar5 >> 5) + (uint)((uVar6 & 0x1f) != 0);
  iVar7 = Abc_NtkObjNumMax(pNtk);
  pVVar8 = Sim_UtilInfoAlloc(iVar7,iVar5,1);
  for (local_40 = 0; iVar7 = Abc_NtkCiNum(pNtk), local_40 < iVar7; local_40 = local_40 + 1) {
    pAVar9 = Abc_NtkCi(pNtk,local_40);
    *(uint *)((long)pVVar8->pArray[pAVar9->Id] + (long)(local_40 >> 5) * 4) =
         1 << ((byte)local_40 & 0x1f) |
         *(uint *)((long)pVVar8->pArray[pAVar9->Id] + (long)(local_40 >> 5) * 4);
  }
  for (local_40 = 0; iVar7 = Vec_PtrSize(pNtk->vObjs), local_40 < iVar7; local_40 = local_40 + 1) {
    pAVar9 = Abc_NtkObj(pNtk,local_40);
    if ((pAVar9 != (Abc_Obj_t *)0x0) && (iVar7 = Abc_ObjIsNode(pAVar9), iVar7 != 0)) {
      pvVar2 = pVVar8->pArray[pAVar9->Id];
      ppvVar3 = pVVar8->pArray;
      iVar7 = Abc_ObjFaninId0(pAVar9);
      pvVar4 = ppvVar3[iVar7];
      ppvVar3 = pVVar8->pArray;
      iVar7 = Abc_ObjFaninId1(pAVar9);
      pvVar1 = ppvVar3[iVar7];
      for (local_44 = 0; local_44 < iVar5; local_44 = local_44 + 1) {
        *(uint *)((long)pvVar2 + (long)local_44 * 4) =
             *(uint *)((long)pvVar4 + (long)local_44 * 4) |
             *(uint *)((long)pvVar1 + (long)local_44 * 4);
      }
    }
  }
  for (local_40 = 0; iVar7 = Abc_NtkCoNum(pNtk), local_40 < iVar7; local_40 = local_40 + 1) {
    pAVar9 = Abc_NtkCo(pNtk,local_40);
    pvVar2 = pVVar8->pArray[pAVar9->Id];
    ppvVar3 = pVVar8->pArray;
    iVar7 = Abc_ObjFaninId0(pAVar9);
    pvVar4 = ppvVar3[iVar7];
    for (local_44 = 0; local_44 < iVar5; local_44 = local_44 + 1) {
      *(undefined4 *)((long)pvVar2 + (long)local_44 * 4) =
           *(undefined4 *)((long)pvVar4 + (long)local_44 * 4);
    }
  }
  return pVVar8;
}

Assistant:

Vec_Ptr_t * Sim_ComputeStrSupp( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSuppStr;
    Abc_Obj_t * pNode;
    unsigned * pSimmNode, * pSimmNode1, * pSimmNode2;
    int nSuppWords, i, k;
    // allocate room for structural supports
    nSuppWords = SIM_NUM_WORDS( Abc_NtkCiNum(pNtk) );
    vSuppStr   = Sim_UtilInfoAlloc( Abc_NtkObjNumMax(pNtk), nSuppWords, 1 );
    // assign the structural support to the PIs
    Abc_NtkForEachCi( pNtk, pNode, i )
        Sim_SuppStrSetVar( vSuppStr, pNode, i );
    // derive the structural supports of the internal nodes
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        pSimmNode  = (unsigned *)vSuppStr->pArray[ pNode->Id ];
        pSimmNode1 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId0(pNode) ];
        pSimmNode2 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId1(pNode) ];
        for ( k = 0; k < nSuppWords; k++ )
            pSimmNode[k] = pSimmNode1[k] | pSimmNode2[k];
    }
    // set the structural supports of the PO nodes
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        pSimmNode  = (unsigned *)vSuppStr->pArray[ pNode->Id ];
        pSimmNode1 = (unsigned *)vSuppStr->pArray[ Abc_ObjFaninId0(pNode) ];
        for ( k = 0; k < nSuppWords; k++ )
            pSimmNode[k] = pSimmNode1[k];
    }
    return vSuppStr;
}